

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O2

char * utf8_decode(char *s,utfint *val,int strict)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  utfint *puVar6;
  uint uVar7;
  uint uVar8;
  
  bVar1 = *s;
  uVar3 = (uint)bVar1;
  uVar8 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    puVar6 = utf8_decode::limits;
    uVar7 = 0;
    uVar5 = 0;
    uVar8 = 0;
    for (; (uVar3 & 0x40) != 0; uVar3 = uVar3 * 2) {
      lVar2 = uVar5 + 1;
      if (((byte)s[lVar2] & 0xffffffc0) != 0x80) {
        return (char *)0x0;
      }
      puVar6 = puVar6 + 1;
      uVar7 = uVar7 + 5;
      uVar5 = uVar5 + 1;
      uVar8 = uVar8 << 6 | (byte)s[lVar2] & 0x3f;
    }
    if (5 < uVar5) {
      return (char *)0x0;
    }
    uVar8 = (uVar3 & 0x3f) << (uVar7 & 0x1f) | uVar8;
    if ((int)uVar8 < 0) {
      return (char *)0x0;
    }
    if (uVar8 < *puVar6) {
      return (char *)0x0;
    }
    s = s + uVar5;
  }
  if ((strict == 0) || ((uVar8 & 0x1ff800) != 0xd800 && uVar8 < 0x110000)) {
    if (val != (utfint *)0x0) {
      *val = uVar8;
    }
    pcVar4 = s + 1;
  }
  else {
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

static const char *utf8_decode (const char *s, utfint *val, int strict) {
  static const utfint limits[] =
        {~(utfint)0, 0x80, 0x800, 0x10000u, 0x200000u, 0x4000000u};
  unsigned int c = (unsigned char)s[0];
  utfint res = 0;  /* final result */
  if (c < 0x80)  /* ascii? */
    res = c;
  else {
    int count = 0;  /* to count number of continuation bytes */
    for (; c & 0x40; c <<= 1) {  /* while it needs continuation bytes... */
      unsigned int cc = (unsigned char)s[++count];  /* read next byte */
      if ((cc & 0xC0) != 0x80)  /* not a continuation byte? */
        return NULL;  /* invalid byte sequence */
      res = (res << 6) | (cc & 0x3F);  /* add lower 6 bits from cont. byte */
    }
    res |= ((utfint)(c & 0x7F) << (count * 5));  /* add first byte */
    if (count > 5 || res > MAXUTF || res < limits[count])
      return NULL;  /* invalid byte sequence */
    s += count;  /* skip continuation bytes read */
  }
  if (strict) {
    /* check for invalid code points; too large or surrogates */
    if (res > MAXUNICODE || (0xD800u <= res && res <= 0xDFFFu))
      return NULL;
  }
  if (val) *val = res;
  return s + 1;  /* +1 to include first byte */
}